

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall
cvm::BasicValue::BasicValue
          (BasicValue *this,BasicType T,
          shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_> *P)

{
  shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_> *P_local;
  BasicType T_local;
  BasicValue *this_local;
  
  this->Type = T;
  std::__cxx11::string::string((string *)&this->StrVal);
  std::shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_>::shared_ptr
            (&this->ArrayPtr,P);
  return;
}

Assistant:

BasicValue::BasicValue(BasicType T,
                       std::shared_ptr<std::vector<BasicValue>> P)
    : Type(T), ArrayPtr(P) {}